

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualsource.cpp
# Opt level: O1

bool QualSource::addSource(Node *node,int t,double b,Pattern *p)

{
  QualSource *pQVar1;
  
  if (node->qualSource == (QualSource *)0x0) {
    pQVar1 = (QualSource *)operator_new(0x30);
    QualSource(pQVar1);
    node->qualSource = pQVar1;
  }
  pQVar1 = node->qualSource;
  pQVar1->type = t;
  pQVar1->base = b;
  pQVar1->pattern = p;
  pQVar1->outflow = 0.0;
  pQVar1->quality = 0.0;
  return true;
}

Assistant:

bool QualSource::addSource(Node* node, int t, double b, Pattern* p)
{
    if ( node->qualSource == nullptr )
    {
        node->qualSource = new QualSource();
        if ( node->qualSource == nullptr ) return false;
    }
    node->qualSource->type = t;
    node->qualSource->base = b;
    node->qualSource->pattern = p;
    node->qualSource->quality = 0.0;
    node->qualSource->outflow = 0.0;
    return true;
}